

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseTextDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  bool bVar2;
  uint local_1c;
  xmlChar *pxStack_18;
  int c;
  xmlChar *version;
  xmlParserCtxtPtr ctxt_local;
  
  if (((((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '?')) && (ctxt->input->cur[2] == 'x')
       ) && ((ctxt->input->cur[3] == 'm' && (ctxt->input->cur[4] == 'l')))) &&
     (((ctxt->input->cur[5] == ' ' || ((8 < ctxt->input->cur[5] && (ctxt->input->cur[5] < 0xb)))) ||
      (ctxt->input->cur[5] == '\r')))) {
    ctxt->input->cur = ctxt->input->cur + 5;
    ctxt->input->col = ctxt->input->col + 5;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    iVar1 = xmlSkipBlankChars(ctxt);
    if (iVar1 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed after \'<?xml\'\n");
    }
    pxStack_18 = xmlParseVersionInfo(ctxt);
    if (pxStack_18 == (xmlChar *)0x0) {
      pxStack_18 = xmlCharStrdup("1.0");
      if (pxStack_18 == (xmlChar *)0x0) {
        xmlErrMemory(ctxt);
        return;
      }
    }
    else {
      iVar1 = xmlSkipBlankChars(ctxt);
      if (iVar1 == 0) {
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed here\n");
      }
    }
    ctxt->input->version = pxStack_18;
    xmlParseEncodingDecl(ctxt);
    xmlSkipBlankChars(ctxt);
    if ((*ctxt->input->cur == '?') && (ctxt->input->cur[1] == '>')) {
      ctxt->input->cur = ctxt->input->cur + 2;
      ctxt->input->col = ctxt->input->col + 2;
      if (*ctxt->input->cur == '\0') {
        xmlParserGrow(ctxt);
      }
    }
    else if (*ctxt->input->cur == '>') {
      xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
      xmlNextChar(ctxt);
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
      do {
        bVar2 = false;
        if (ctxt->disableSAX < 2) {
          local_1c = (uint)*ctxt->input->cur;
          bVar2 = local_1c != 0;
        }
      } while ((bVar2) && (xmlNextChar(ctxt), local_1c != 0x3e));
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_STARTED,(char *)0x0);
  }
  return;
}

Assistant:

void
xmlParseTextDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *version;

    /*
     * We know that '<?xml' is here.
     */
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {
	SKIP(5);
    } else {
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_STARTED, NULL);
	return;
    }

    if (SKIP_BLANKS == 0) {
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		       "Space needed after '<?xml'\n");
    }

    /*
     * We may have the VersionInfo here.
     */
    version = xmlParseVersionInfo(ctxt);
    if (version == NULL) {
	version = xmlCharStrdup(XML_DEFAULT_VERSION);
        if (version == NULL) {
            xmlErrMemory(ctxt);
            return;
        }
    } else {
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space needed here\n");
	}
    }
    ctxt->input->version = version;

    /*
     * We must have the encoding declaration
     */
    xmlParseEncodingDecl(ctxt);

    SKIP_BLANKS;
    if ((RAW == '?') && (NXT(1) == '>')) {
        SKIP(2);
    } else if (RAW == '>') {
        /* Deprecated old WD ... */
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	NEXT;
    } else {
        int c;

	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
        while ((PARSER_STOPPED(ctxt) == 0) && ((c = CUR) != 0)) {
            NEXT;
            if (c == '>')
                break;
        }
    }
}